

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

void Imf_2_5::anon_unknown_1::initialize
               (Header *header,Box2i *displayWindow,Box2i *dataWindow,float pixelAspectRatio,
               V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
               Compression compression)

{
  ArgExc *this;
  Compression compression_local;
  LineOrder lineOrder_local;
  float screenWindowWidth_local;
  float pixelAspectRatio_local;
  stringstream _iex_throw_s;
  float fStack_1a0;
  float fStack_19c;
  ostream local_198 [16];
  undefined1 local_188 [16];
  size_t local_178;
  
  compression_local = compression;
  lineOrder_local = lineOrder;
  screenWindowWidth_local = screenWindowWidth;
  pixelAspectRatio_local = pixelAspectRatio;
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::TypedAttribute
            ((TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *)&_iex_throw_s,displayWindow);
  Header::insert(header,"displayWindow",(Attribute *)&_iex_throw_s);
  Attribute::~Attribute((Attribute *)&_iex_throw_s);
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::TypedAttribute
            ((TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *)&_iex_throw_s,dataWindow);
  Header::insert(header,"dataWindow",(Attribute *)&_iex_throw_s);
  Attribute::~Attribute((Attribute *)&_iex_throw_s);
  if ((int)ABS(pixelAspectRatio) - 0x800000U < 0x7f000000 && -1 < (int)pixelAspectRatio) {
    TypedAttribute<float>::TypedAttribute
              ((TypedAttribute<float> *)&_iex_throw_s,&pixelAspectRatio_local);
    Header::insert(header,"pixelAspectRatio",(Attribute *)&_iex_throw_s);
    Attribute::~Attribute((Attribute *)&_iex_throw_s);
    TypedAttribute<Imath_2_5::Vec2<float>_>::TypedAttribute
              ((TypedAttribute<Imath_2_5::Vec2<float>_> *)&_iex_throw_s,screenWindowCenter);
    Header::insert(header,"screenWindowCenter",(Attribute *)&_iex_throw_s);
    Attribute::~Attribute((Attribute *)&_iex_throw_s);
    TypedAttribute<float>::TypedAttribute
              ((TypedAttribute<float> *)&_iex_throw_s,&screenWindowWidth_local);
    Header::insert(header,"screenWindowWidth",(Attribute *)&_iex_throw_s);
    Attribute::~Attribute((Attribute *)&_iex_throw_s);
    TypedAttribute<Imf_2_5::LineOrder>::TypedAttribute
              ((TypedAttribute<Imf_2_5::LineOrder> *)&_iex_throw_s,&lineOrder_local);
    Header::insert(header,"lineOrder",(Attribute *)&_iex_throw_s);
    Attribute::~Attribute((Attribute *)&_iex_throw_s);
    TypedAttribute<Imf_2_5::Compression>::TypedAttribute
              ((TypedAttribute<Imf_2_5::Compression> *)&_iex_throw_s,&compression_local);
    Header::insert(header,"compression",(Attribute *)&_iex_throw_s);
    Attribute::~Attribute((Attribute *)&_iex_throw_s);
    local_188 = (undefined1  [16])0x0;
    local_198[0] = (ostream)0x0;
    local_198[1] = (ostream)0x0;
    local_198[2] = (ostream)0x0;
    local_198[3] = (ostream)0x0;
    local_198[4] = (ostream)0x0;
    local_198[5] = (ostream)0x0;
    local_198[6] = (ostream)0x0;
    local_198[7] = (ostream)0x0;
    local_198[8] = (ostream)0x0;
    local_198[9] = (ostream)0x0;
    local_198[10] = (ostream)0x0;
    local_198[0xb] = (ostream)0x0;
    local_198[0xc] = (ostream)0x0;
    local_198[0xd] = (ostream)0x0;
    local_198[0xe] = (ostream)0x0;
    local_198[0xf] = (ostream)0x0;
    __iex_throw_s = (_func_int **)0x0;
    fStack_1a0 = 0.0;
    fStack_19c = 0.0;
    local_178 = 0;
    TypedAttribute<Imf_2_5::ChannelList>::TypedAttribute
              ((TypedAttribute<Imf_2_5::ChannelList> *)&_iex_throw_s);
    Header::insert(header,"channels",(Attribute *)&_iex_throw_s);
    TypedAttribute<Imf_2_5::ChannelList>::~TypedAttribute
              ((TypedAttribute<Imf_2_5::ChannelList> *)&_iex_throw_s);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::operator<<(local_198,"Invalid pixel aspect ratio");
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,(stringstream *)&_iex_throw_s);
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
initialize (Header &header,
	    const Box2i &displayWindow,
	    const Box2i &dataWindow,
	    float pixelAspectRatio,
	    const V2f &screenWindowCenter,
	    float screenWindowWidth,
	    LineOrder lineOrder,
	    Compression compression)
{
    header.insert ("displayWindow", Box2iAttribute (displayWindow));
    header.insert ("dataWindow", Box2iAttribute (dataWindow));
    if ( !std::isnormal (pixelAspectRatio) || pixelAspectRatio < 0.f)
        THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel aspect ratio");
    header.insert ("pixelAspectRatio", FloatAttribute (pixelAspectRatio));
    header.insert ("screenWindowCenter", V2fAttribute (screenWindowCenter));
    header.insert ("screenWindowWidth", FloatAttribute (screenWindowWidth));
    header.insert ("lineOrder", LineOrderAttribute (lineOrder));
    header.insert ("compression", CompressionAttribute (compression));
    header.insert ("channels", ChannelListAttribute ());
}